

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnImportTag
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index tag_index,Index sig_index)

{
  ModuleDesc *pMVar1;
  bool bVar2;
  undefined1 local_198 [16];
  string local_188;
  allocator<char> local_161;
  string local_160;
  ImportType local_140;
  undefined1 local_f8 [8];
  TagType tag_type;
  FuncType *func_type;
  Var local_a8;
  Location local_60;
  Enum local_40;
  Index local_3c;
  BinaryReaderInterp *pBStack_38;
  Index import_index_local;
  BinaryReaderInterp *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local._M_len = (size_t)field_name._M_str;
  this_local = (BinaryReaderInterp *)field_name._M_len;
  module_name_local._M_len = (size_t)module_name._M_str;
  field_name_local._M_str = (char *)module_name._M_len;
  local_3c = import_index;
  pBStack_38 = this;
  GetLocation(&local_60,this);
  GetLocation((Location *)&func_type,this);
  Var::Var(&local_a8,sig_index,(Location *)&func_type);
  local_40 = (Enum)SharedValidator::OnTag(&this->validator_,&local_60,&local_a8);
  bVar2 = Failed((Result)local_40);
  Var::~Var(&local_a8);
  if (bVar2) {
    Result::Result((Result *)((long)&module_name_local._M_str + 4),Error);
  }
  else {
    tag_type.signature.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::
                  operator[](&this->module_->func_types,(ulong)sig_index);
    TagType::TagType((TagType *)local_f8,Exception,
                     &((reference)
                      tag_type.signature.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->params);
    pMVar1 = this->module_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_160,
               (basic_string_view<char,_std::char_traits<char>_> *)&field_name_local._M_str,
               &local_161);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_188,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
               (allocator<char> *)(local_198 + 0xf));
    TagType::Clone((TagType *)local_198);
    ImportType::ImportType
              (&local_140,&local_160,&local_188,
               (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                *)local_198);
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::push_back
              (&pMVar1->imports,(value_type *)&local_140);
    ImportDesc::~ImportDesc((ImportDesc *)&local_140);
    std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
    ~unique_ptr((unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                 *)local_198);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator((allocator<char> *)(local_198 + 0xf));
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    std::vector<wabt::interp::TagType,_std::allocator<wabt::interp::TagType>_>::push_back
              (&this->tag_types_,(value_type *)local_f8);
    Result::Result((Result *)((long)&module_name_local._M_str + 4),Ok);
    TagType::~TagType((TagType *)local_f8);
  }
  return (Result)module_name_local._M_str._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnImportTag(Index import_index,
                                       std::string_view module_name,
                                       std::string_view field_name,
                                       Index tag_index,
                                       Index sig_index) {
  CHECK_RESULT(validator_.OnTag(GetLocation(), Var(sig_index, GetLocation())));
  FuncType& func_type = module_.func_types[sig_index];
  TagType tag_type{TagAttr::Exception, func_type.params};
  module_.imports.push_back(ImportDesc{ImportType(
      std::string(module_name), std::string(field_name), tag_type.Clone())});
  tag_types_.push_back(tag_type);
  return Result::Ok;
}